

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseTerminalType(ParseContext *ctx,bool *shrBorrow)

{
  Lexeme *begin;
  _func_int **pp_Var1;
  SynBase *pSVar2;
  SynBase *pSVar3;
  SynIdentifier *pSVar4;
  bool bVar5;
  int iVar6;
  SynNamespaceElement *parent;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined **ppuVar8;
  undefined4 extraout_var_02;
  SynBase *pSVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  SynBase *pSVar10;
  Lexeme *pLVar11;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint uVar12;
  Lexeme *pLVar13;
  Lexeme *pLVar14;
  InplaceStr name;
  IntrusiveList<SynBase> types;
  IntrusiveList<SynIdentifier> namespacePath;
  IntrusiveList<SynBase> local_58;
  IntrusiveList<SynIdentifier> local_48;
  SynIdentifier *pSVar7;
  undefined4 extraout_var_03;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_auto) {
    ctx->currentLexeme = begin + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar10 = (SynBase *)CONCAT44(extraout_var_00,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar10,5,begin,ctx->currentLexeme + -1);
      ppuVar8 = &PTR__SynBase_003f6de0;
LAB_0021f353:
      pSVar10->_vptr_SynBase = (_func_int **)ppuVar8;
      return pSVar10;
    }
  }
  else if (begin->type == lex_string) {
    pLVar13 = (Lexeme *)begin->pos;
    uVar12 = begin->length;
    ctx->currentLexeme = begin + 1;
    pLVar14 = (Lexeme *)((long)&pLVar13->type + (ulong)uVar12);
    local_48.head = (SynIdentifier *)0x0;
    local_48.tail = (SynIdentifier *)0x0;
    if (begin[1].type == lex_point) {
      parent = (SynNamespaceElement *)0x0;
      do {
        name.end = (char *)pLVar14;
        name.begin = (char *)pLVar13;
        parent = ParseContext::IsNamespace(ctx,parent,name);
        if (parent == (SynNamespaceElement *)0x0) break;
        if (ctx->currentLexeme->type != lex_none) {
          ctx->currentLexeme = ctx->currentLexeme + 1;
        }
        bVar5 = anon_unknown.dwarf_16d1cf::CheckAt
                          (ctx,lex_string,"ERROR: namespace member is expected after \'.\'");
        if (!bVar5) {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar7 = (SynIdentifier *)CONCAT44(extraout_var_06,iVar6);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021f838;
          SynBase::SynBase((SynBase *)pSVar7,4,begin,ctx->currentLexeme + -1);
          (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
          (pSVar7->name).begin = (char *)pLVar13;
          (pSVar7->name).end = (char *)pLVar14;
          IntrusiveList<SynIdentifier>::push_back(&local_48,pSVar7);
          break;
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar7 = (SynIdentifier *)CONCAT44(extraout_var,iVar6);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021f838;
        SynBase::SynBase((SynBase *)pSVar7,4,begin,ctx->currentLexeme + -1);
        (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        (pSVar7->name).begin = (char *)pLVar13;
        (pSVar7->name).end = (char *)pLVar14;
        IntrusiveList<SynIdentifier>::push_back(&local_48,pSVar7);
        pLVar14 = ctx->currentLexeme;
        pLVar13 = (Lexeme *)pLVar14->pos;
        uVar12 = pLVar14->length;
        if (pLVar14->type != lex_none) {
          ctx->currentLexeme = pLVar14 + 1;
        }
        pLVar14 = (Lexeme *)((long)&pLVar13->type + (ulong)uVar12);
      } while (ctx->currentLexeme->type == lex_point);
    }
    if (ctx->currentLexeme->type == lex_less) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      local_58.head = (SynBase *)0x0;
      local_58.tail = (SynBase *)0x0;
      pSVar10 = ParseType(ctx,shrBorrow,false);
      if (pSVar10 == (SynBase *)0x0) {
        if (ctx->currentLexeme->type == lex_greater) {
          anon_unknown.dwarf_16d1cf::Report
                    (ctx,ctx->currentLexeme,"ERROR: typename required after \'<\'");
        }
        goto LAB_0021f81c;
      }
      IntrusiveList<SynBase>::push_back(&local_58,pSVar10);
      pLVar11 = ctx->currentLexeme;
      if (pLVar11->type == lex_comma) {
        do {
          ctx->currentLexeme = pLVar11 + 1;
          pSVar10 = ParseType(ctx,shrBorrow,false);
          if (pSVar10 == (SynBase *)0x0) {
            anon_unknown.dwarf_16d1cf::Report
                      (ctx,ctx->currentLexeme,"ERROR: typename required after \',\'");
            break;
          }
          IntrusiveList<SynBase>::push_back(&local_58,pSVar10);
          pLVar11 = ctx->currentLexeme;
        } while (pLVar11->type == lex_comma);
      }
      if (ctx->currentLexeme->type == lex_greater) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      else {
        pLVar11 = ctx->currentLexeme;
        if (pLVar11->type == lex_shr) {
          bVar5 = *shrBorrow;
          if (bVar5 == true) {
            ctx->currentLexeme = pLVar11 + 1;
          }
          *shrBorrow = (bool)(bVar5 ^ 1);
        }
        else {
          if (local_58.head == (SynBase *)0x0) {
LAB_0021f81c:
            ctx->currentLexeme = begin;
            return (SynBase *)0x0;
          }
          uVar12 = 0;
          pSVar10 = local_58.head;
          do {
            uVar12 = uVar12 + 1;
            pSVar10 = pSVar10->next;
          } while (pSVar10 != (SynBase *)0x0);
          if (uVar12 < 2) goto LAB_0021f81c;
          anon_unknown.dwarf_16d1cf::Report
                    (ctx,pLVar11,"ERROR: \'>\' expected after generic type alias list");
        }
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      pSVar10 = (SynBase *)CONCAT44(extraout_var_08,iVar6);
      pLVar11 = ctx->currentLexeme;
      if (ctx->firstLexeme < pLVar11) {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
        pSVar4 = local_48.tail;
        pSVar7 = local_48.head;
        pSVar9 = (SynBase *)CONCAT44(extraout_var_09,iVar6);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase(pSVar9,7,begin,ctx->currentLexeme + -1);
          pSVar3 = local_58.tail;
          pSVar2 = local_58.head;
          pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d00;
          pSVar9[1]._vptr_SynBase = (_func_int **)pSVar7;
          *(SynIdentifier **)&pSVar9[1].typeID = pSVar4;
          pSVar9[1].begin = pLVar13;
          pSVar9[1].end = pLVar14;
          SynBase::SynBase(pSVar10,0xc,begin,pLVar11 + -1);
          pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f75e8;
          pSVar10[1]._vptr_SynBase = (_func_int **)pSVar9;
          *(SynBase **)&pSVar10[1].typeID = pSVar2;
          pSVar10[1].begin = (Lexeme *)pSVar3;
          return pSVar10;
        }
      }
    }
    else {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
      pSVar4 = local_48.tail;
      pSVar7 = local_48.head;
      pSVar10 = (SynBase *)CONCAT44(extraout_var_07,iVar6);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(pSVar10,7,begin,ctx->currentLexeme + -1);
        pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d00;
        pSVar10[1]._vptr_SynBase = (_func_int **)pSVar7;
        *(SynIdentifier **)&pSVar10[1].typeID = pSVar4;
        pSVar10[1].begin = pLVar13;
        pSVar10[1].end = pLVar14;
        return pSVar10;
      }
    }
  }
  else if (ctx->currentLexeme->type == lex_generic) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar10 = (SynBase *)CONCAT44(extraout_var_01,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar10,6,begin,ctx->currentLexeme + -1);
      ppuVar8 = &PTR__SynBase_003f7620;
      goto LAB_0021f353;
    }
  }
  else if (ctx->currentLexeme->type == lex_typeof) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_oparen,"ERROR: typeof must be followed by \'(\'");
    pSVar10 = ParseAssignment(ctx);
    if (pSVar10 == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after typeof(");
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar10 = (SynBase *)CONCAT44(extraout_var_02,iVar6);
      SynBase::SynBase(pSVar10,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in typeof");
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pSVar9 = (SynBase *)CONCAT44(extraout_var_03,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar9,0xd,begin,ctx->currentLexeme + -1);
      pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7658;
      pSVar9[1]._vptr_SynBase = (_func_int **)pSVar10;
      pSVar10 = ParsePostExpressions(ctx,pSVar9);
      return pSVar10;
    }
  }
  else {
    pLVar13 = ctx->currentLexeme;
    if (pLVar13->type != lex_at) {
      return (SynBase *)0x0;
    }
    ctx->currentLexeme = pLVar13 + 1;
    if (pLVar13[1].type != lex_string) goto LAB_0021f81c;
    pp_Var1 = (_func_int **)pLVar13[1].pos;
    uVar12 = pLVar13[1].length;
    ctx->currentLexeme = pLVar13 + 2;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar10 = (SynBase *)CONCAT44(extraout_var_04,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      pLVar13 = ctx->currentLexeme + -1;
      SynBase::SynBase(pSVar10,4,pLVar13,pLVar13);
      pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      pSVar10[1]._vptr_SynBase = pp_Var1;
      *(ulong *)&pSVar10[1].typeID = (long)pp_Var1 + (ulong)uVar12;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar9 = (SynBase *)CONCAT44(extraout_var_05,iVar6);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(pSVar9,8,begin,ctx->currentLexeme + -1);
        pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7690;
        pSVar9[1]._vptr_SynBase = (_func_int **)pSVar10;
        return pSVar9;
      }
    }
  }
LAB_0021f838:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynBase* ParseTerminalType(ParseContext &ctx, bool &shrBorrow)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();

		IntrusiveList<SynIdentifier> namespacePath;

		SynNamespaceElement *ns = NULL;

		while(ctx.At(lex_point) && (ns = ctx.IsNamespace(ns, name)) != NULL)
		{
			ctx.Skip();

			if(!CheckAt(ctx, lex_string, "ERROR: namespace member is expected after '.'"))
			{
				namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

				break;
			}

			namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

			name = ctx.Consume();
		}

		if(ctx.Consume(lex_less))
		{
			IntrusiveList<SynBase> types;

			SynBase *type = ParseType(ctx, &shrBorrow);

			if(!type)
			{
				if(ctx.Peek() == lex_greater)
					Report(ctx, ctx.Current(), "ERROR: typename required after '<'");

				// Backtrack
				ctx.currentLexeme = start;

				return NULL;
			}

			types.push_back(type);

			while(ctx.Consume(lex_comma))
			{
				type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					Report(ctx, ctx.Current(), "ERROR: typename required after ','");

					break;
				}

				types.push_back(type);
			}

			bool closed = ctx.Consume(lex_greater);

			if(!closed && ctx.At(lex_shr))
			{
				if(shrBorrow)
					ctx.Skip();

				shrBorrow = !shrBorrow;

				closed = true;
			}

			if(!closed)
			{
				if(types.size() > 1)
				{
					Report(ctx, ctx.Current(), "ERROR: '>' expected after generic type alias list");
				}
				else
				{
					// Backtrack
					ctx.currentLexeme = start;

					return NULL;
				}
			}

			return new (ctx.get<SynTypeGenericInstance>()) SynTypeGenericInstance(start, ctx.Previous(), new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name), types);
		}

		return new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name);
	}

	if(ctx.Consume(lex_auto))
		return new (ctx.get<SynTypeAuto>()) SynTypeAuto(start, ctx.Previous());

	if(ctx.Consume(lex_generic))
		return new (ctx.get<SynTypeGeneric>()) SynTypeGeneric(start, ctx.Previous());

	if(ctx.Consume(lex_typeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: typeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after typeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in typeof");

		SynBase *node = new (ctx.get<SynTypeof>()) SynTypeof(start, ctx.Previous(), value);

		return ParsePostExpressions(ctx, node);
	}

	if(ctx.Consume(lex_at))
	{
		if(!ctx.At(lex_string))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		return new (ctx.get<SynTypeAlias>()) SynTypeAlias(start, ctx.Previous(), nameIdentifier);
	}

	return NULL;
}